

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dobjtype.cpp
# Opt level: O2

void __thiscall PClass::InitializeSpecials(PClass *this,void *addr)

{
  long lVar1;
  pair<const_PType_*,_unsigned_int> *ppVar2;
  
  if (this->bRuntimeClass == true) {
    if (this->ParentClass == (PClass *)0x0) {
      __assert_fail("ParentClass != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/dobjtype.cpp"
                    ,0xc5c,"void PClass::InitializeSpecials(void *) const");
    }
    InitializeSpecials(this->ParentClass,addr);
    ppVar2 = (this->SpecialInits).Array;
    for (lVar1 = (ulong)(this->SpecialInits).Count << 4; lVar1 != 0; lVar1 = lVar1 + -0x10) {
      (*(ppVar2->first->super_DObject)._vptr_DObject[10])
                (ppVar2->first,(long)addr + (ulong)ppVar2->second,this->Defaults + ppVar2->second);
      ppVar2 = ppVar2 + 1;
    }
  }
  return;
}

Assistant:

void PClass::InitializeSpecials(void *addr) const
{
	// Once we reach a native class, we can stop going up the family tree,
	// since native classes handle initialization natively.
	if (!bRuntimeClass)
	{
		return;
	}
	assert(ParentClass != NULL);
	ParentClass->InitializeSpecials(addr);
	for (auto tao : SpecialInits)
	{
		tao.first->InitializeValue((BYTE*)addr + tao.second, Defaults + tao.second);
	}
}